

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall MutatorThread::threadFunc(MutatorThread *this)

{
  uint64_t uVar1;
  long in_RDI;
  uint64_t threadId;
  
  uVar1 = axl::sys::getCurrentThreadId();
  while ((*(byte *)(in_RDI + 0x10) & 1) == 0) {
    printf("  mutator thread TID:%lld is working...\n",uVar1);
    axl::sys::sleep(200);
    Gc::gcSafePoint((Gc *)0x130eb2);
  }
  printf("  mutator thread TID:%lld is finished.\n",uVar1);
  return;
}

Assistant:

void
	threadFunc() {
		uint64_t threadId = sys::getCurrentThreadId();

		GC_BEGIN()

		for (;;) {
			if (m_terminateFlag)
				break;

			printf("  mutator thread TID:%lld is working...\n", threadId);
			sys::sleep(200);
			g_gc->gcSafePoint();
		}

		printf("  mutator thread TID:%lld is finished.\n", threadId);

		GC_END()
	}